

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

uint64_t __thiscall
ami_nvar_t::nvar_entry_body_t::extended_header_timestamp(nvar_entry_body_t *this)

{
  kstream *pkVar1;
  bool bVar2;
  uint16_t uVar3;
  nvar_entry_t *pnVar4;
  nvar_attributes_t *pnVar5;
  nvar_extended_attributes_t *this_00;
  uint64_t uVar6;
  kstream *this_01;
  undefined1 local_28 [8];
  streampos _pos;
  nvar_entry_body_t *this_local;
  
  if ((this->f_extended_header_timestamp & 1U) == 0) {
    this->n_extended_header_timestamp = true;
    _pos._M_state = (__mbstate_t)this;
    pnVar4 = _parent(this);
    pnVar5 = nvar_entry_t::attributes(pnVar4);
    bVar2 = nvar_attributes_t::valid(pnVar5);
    if (bVar2) {
      pnVar4 = _parent(this);
      pnVar5 = nvar_entry_t::attributes(pnVar4);
      bVar2 = nvar_attributes_t::extended_header(pnVar5);
      if ((bVar2) && (uVar3 = extended_header_size(this), 10 < uVar3)) {
        this_00 = extended_header_attributes(this);
        bVar2 = nvar_extended_attributes_t::time_based_auth(this_00);
        if (bVar2) {
          this->n_extended_header_timestamp = false;
          uVar6 = kaitai::kstream::pos((this->super_kstruct).m__io);
          std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)local_28,uVar6);
          pkVar1 = (this->super_kstruct).m__io;
          this_01 = kaitai::kstruct::_io(&this->super_kstruct);
          uVar6 = kaitai::kstream::pos(this_01);
          uVar3 = extended_header_size(this);
          kaitai::kstream::seek(pkVar1,(uVar6 - uVar3) + 1);
          uVar6 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
          this->m_extended_header_timestamp = uVar6;
          pkVar1 = (this->super_kstruct).m__io;
          uVar6 = std::fpos::operator_cast_to_long((fpos *)local_28);
          kaitai::kstream::seek(pkVar1,uVar6);
          this->f_extended_header_timestamp = true;
        }
      }
    }
    this_local = (nvar_entry_body_t *)this->m_extended_header_timestamp;
  }
  else {
    this_local = (nvar_entry_body_t *)this->m_extended_header_timestamp;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t ami_nvar_t::nvar_entry_body_t::extended_header_timestamp() {
    if (f_extended_header_timestamp)
        return m_extended_header_timestamp;
    n_extended_header_timestamp = true;
    if ( ((_parent()->attributes()->valid()) && (_parent()->attributes()->extended_header()) && (extended_header_size() >= ((1 + 8) + 2)) && (extended_header_attributes()->time_based_auth())) ) {
        n_extended_header_timestamp = false;
        std::streampos _pos = m__io->pos();
        m__io->seek(((_io()->pos() - extended_header_size()) + 1));
        m_extended_header_timestamp = m__io->read_u8le();
        m__io->seek(_pos);
        f_extended_header_timestamp = true;
    }
    return m_extended_header_timestamp;
}